

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

void uv__signal_loop_cleanup(uv_loop_t *loop)

{
  long in_RDI;
  uv_handle_t *handle;
  QUEUE *q;
  uv_signal_t *in_stack_00000070;
  undefined8 *puVar1;
  
  for (puVar1 = *(undefined8 **)(in_RDI + 0x10); puVar1 != (undefined8 *)(in_RDI + 0x10);
      puVar1 = (undefined8 *)*puVar1) {
    if (*(int *)(puVar1 + -1) == 0x10) {
      uv__signal_stop(in_stack_00000070);
    }
  }
  if (*(int *)(in_RDI + 0x1c0) != -1) {
    uv__close((int)((ulong)puVar1 >> 0x20));
    *(undefined4 *)(in_RDI + 0x1c0) = 0xffffffff;
  }
  if (*(int *)(in_RDI + 0x1c4) != -1) {
    uv__close((int)((ulong)puVar1 >> 0x20));
    *(undefined4 *)(in_RDI + 0x1c4) = 0xffffffff;
  }
  return;
}

Assistant:

void uv__signal_loop_cleanup(uv_loop_t* loop) {
  QUEUE* q;

  /* Stop all the signal watchers that are still attached to this loop. This
   * ensures that the (shared) signal tree doesn't contain any invalid entries
   * entries, and that signal handlers are removed when appropriate.
   */
  QUEUE_FOREACH(q, &loop->handle_queue) {
    uv_handle_t* handle = QUEUE_DATA(q, uv_handle_t, handle_queue);

    if (handle->type == UV_SIGNAL)
      uv__signal_stop((uv_signal_t*) handle);
  }

  if (loop->signal_pipefd[0] != -1) {
    uv__close(loop->signal_pipefd[0]);
    loop->signal_pipefd[0] = -1;
  }

  if (loop->signal_pipefd[1] != -1) {
    uv__close(loop->signal_pipefd[1]);
    loop->signal_pipefd[1] = -1;
  }
}